

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.h
# Opt level: O2

bool __thiscall
soul::UTF8Reader::advanceIfStartsWith<char_const*>(UTF8Reader *this,char *text,char *others)

{
  bool bVar1;
  
  bVar1 = advanceIfStartsWith(this,text);
  if (bVar1) {
    return true;
  }
  bVar1 = advanceIfStartsWith(this,others);
  return bVar1;
}

Assistant:

bool advanceIfStartsWith (const char* text, Args... others)      { return advanceIfStartsWith (text) || advanceIfStartsWith (others...); }